

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::JobManager::PrepareDtlsConfig
          (Error *__return_storage_ptr__,JobManager *this,uint64_t aNid,Config *aConfig)

{
  bool bVar1;
  ErrorCode EVar2;
  element_type *peVar3;
  ulong uVar4;
  string *psVar5;
  size_type sVar6;
  v10 *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar7;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  string local_d10;
  anon_class_1_0_00000001 local_cea;
  v10 local_ce9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_ce8;
  char *local_ce0;
  string local_cd8;
  Error local_cb8;
  allocator local_c89;
  string local_c88;
  Error local_c68;
  string local_c40;
  anon_class_1_0_00000001 local_c1a;
  v10 local_c19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c18;
  char *local_c10;
  string local_c08;
  allocator local_be1;
  string local_be0;
  Error local_bc0;
  Error local_b98;
  Error local_b70;
  string local_b48;
  anon_class_1_0_00000001 local_b22;
  v10 local_b21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b20;
  char *local_b18;
  string local_b10;
  allocator local_ae9;
  string local_ae8;
  Error local_ac8;
  string local_aa0;
  Error local_a80;
  Error local_a58;
  string local_a30;
  anon_class_1_0_00000001 local_a0a;
  v10 local_a09;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a08;
  char *local_a00;
  string local_9f8;
  allocator local_9d1;
  string local_9d0;
  Error local_9b0;
  string local_988;
  anon_class_1_0_00000001 local_962;
  v10 local_961;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_960;
  char *local_958;
  string local_950;
  allocator local_929;
  string local_928;
  Error local_908;
  Error local_8e0;
  undefined1 local_8b4 [4];
  string local_8b0;
  anon_class_1_0_00000001 local_88a;
  v10 local_889;
  v10 *local_888;
  char *local_880;
  string local_878;
  allocator local_851;
  string local_850;
  string local_830;
  anon_class_1_0_00000001 local_80a;
  v10 local_809;
  v10 *local_808;
  char *local_800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8;
  Error local_7d8;
  reference local_7b0;
  BorderRouter *br;
  iterator __end2;
  iterator __begin2;
  BRArray *__range2;
  undefined8 local_788;
  char *local_780;
  string local_778;
  Error local_758;
  Status local_72b;
  byte local_72a;
  byte local_729;
  undefined1 local_728 [5];
  RegistryStatus status;
  bool needPSKc;
  bool needCert;
  BRArray brs;
  undefined1 local_700 [8];
  Network nwk;
  SecurityMaterials dtlsConfig;
  undefined1 local_620 [7];
  bool isCCM;
  string domainName;
  Config *aConfig_local;
  uint64_t aNid_local;
  JobManager *this_local;
  Error *error;
  undefined1 local_5c8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5b8;
  char *local_5b0;
  string *local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5a0;
  char *pcStack_598;
  string *local_590;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_588 [2];
  undefined1 local_578 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_568;
  char *local_560;
  string *local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_550;
  char *pcStack_548;
  string *local_540;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_538 [2];
  undefined1 local_528 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_518;
  char *local_510;
  string *local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_500;
  char *pcStack_4f8;
  string *local_4f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> *local_4e8 [2];
  undefined1 local_4d8 [16];
  v10 *local_4c8;
  char *local_4c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> *local_4b8;
  v10 *local_4b0;
  char *pcStack_4a8;
  string *local_4a0;
  v10 *local_498;
  undefined8 *local_490;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_488 [2];
  undefined1 local_478 [16];
  v10 *local_468;
  char *local_460;
  string *local_458;
  v10 *local_450;
  char *pcStack_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_440;
  v10 *local_438;
  v10 **local_430;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_428;
  undefined1 local_400 [16];
  v10 *local_3f0;
  char *local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3e0;
  v10 *local_3d8;
  v10 *local_3d0;
  char *pcStack_3c8;
  string *local_3c0;
  v10 *local_3b8;
  v10 **local_3b0;
  v10 *local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_3a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_398;
  undefined1 local_370 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_360;
  char *local_358;
  Network *local_350;
  string *local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_340;
  char *pcStack_338;
  string *local_330;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_328;
  undefined1 local_308 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f8;
  char *local_2f0;
  Network *local_2e8;
  string *local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d8;
  char *pcStack_2d0;
  string *local_2c8;
  v10 *local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_2b8;
  v10 *local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_2a8;
  v10 *local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_298;
  v10 *local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_278;
  char *pcStack_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_258;
  char *pcStack_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_238;
  char *pcStack_230;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_220;
  undefined1 *local_218;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_210;
  undefined8 local_208;
  undefined1 *local_200;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_1f8;
  undefined1 *local_1f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_1e8;
  undefined8 local_1e0;
  undefined1 *local_1d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_1d0;
  undefined1 *local_1c8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_1c0;
  undefined8 local_1b8;
  undefined1 *local_1b0;
  Error **local_1a8;
  undefined1 *local_1a0;
  Error **local_198;
  undefined8 local_190;
  undefined1 *local_188;
  Error **local_180;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_178;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_170;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_168;
  v10 **local_160;
  v10 *local_158;
  char *pcStack_150;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> **local_140;
  undefined1 *local_138;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> **local_130;
  undefined8 local_128;
  undefined1 *local_120;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> **local_118;
  v10 **local_110;
  v10 *local_108;
  char *pcStack_100;
  v10 **local_f0;
  v10 *local_e8;
  char *pcStack_e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_d0;
  undefined1 *local_c8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_c0;
  undefined8 local_b8;
  undefined1 *local_b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  char *pcStack_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  char *pcStack_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_68;
  undefined1 *local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  undefined8 local_50;
  undefined1 *local_48;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_28;
  undefined8 local_20;
  undefined1 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  domainName.field_2._M_local_buf[0xf] = '\0';
  Error::Error(__return_storage_ptr__);
  std::__cxx11::string::string((string *)local_620);
  dtlsConfig.mCommissionerToken.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  security_material::SecurityMaterials::SecurityMaterials((SecurityMaterials *)&nwk.mCcm);
  persistent_storage::Network::Network((Network *)local_700);
  std::
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ::vector((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
            *)local_728);
  local_729 = 0;
  local_72a = 0;
  peVar3 = std::
           __shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mInterpreter->mRegistry);
  this_00 = (v10 *)aNid;
  local_72b = persistent_storage::Registry::GetBorderRoutersInNetwork
                        (peVar3,aNid,
                         (vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                          *)local_728);
  if (local_72b != kSuccess) {
    PrepareDtlsConfig::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)((long)&__range2 + 6));
    local_490 = &local_788;
    local_498 = (v10 *)((long)&__range2 + 7);
    bVar7 = ::fmt::v10::operator()(local_498);
    local_780 = (char *)bVar7.size_;
    local_788 = bVar7.data_;
    ::fmt::v10::detail::check_format_string<int,_FMT_COMPILE_STRING,_0>();
    __range2._0_4_ = (uint)local_72b;
    local_4a0 = &local_778;
    local_4b0 = (v10 *)local_788;
    pcStack_4a8 = local_780;
    local_4b8 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> *)
                &__range2;
    local_160 = &local_4b0;
    local_4c8 = (v10 *)local_788;
    local_4c0 = local_780;
    local_158 = local_4c8;
    pcStack_150 = local_4c0;
    local_4e8[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,int>
                             (local_4b8,this_00,(int *)local_4a0);
    local_138 = local_4d8;
    local_140 = local_4e8;
    local_128 = 1;
    fmt.size_ = 1;
    fmt.data_ = local_4c0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_140;
    local_130 = local_140;
    local_120 = local_138;
    local_118 = local_140;
    ::fmt::v10::vformat_abi_cxx11_(&local_778,local_4c8,fmt,args);
    Error::Error(&local_758,kRegistryError,&local_778);
    Error::operator=(__return_storage_ptr__,&local_758);
    Error::~Error(&local_758);
    std::__cxx11::string::~string((string *)&local_778);
    goto LAB_003b633e;
  }
  __end2 = std::
           vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
           ::begin((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                    *)local_728);
  br = (BorderRouter *)
       std::
       vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
       ::end((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
              *)local_728);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<ot::commissioner::persistent_storage::BorderRouter_*,_std::vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>_>
                                     *)&br), bVar1) {
    local_7b0 = __gnu_cxx::
                __normal_iterator<ot::commissioner::persistent_storage::BorderRouter_*,_std::vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>_>
                ::operator*(&__end2);
    if ((((uint)(local_7b0->mAgent).mState & 7) == 3) ||
       (((uint)(local_7b0->mAgent).mState & 7) == 4)) {
      local_729 = 1;
    }
    if ((((uint)(local_7b0->mAgent).mState & 7) == 3) ||
       (((uint)(local_7b0->mAgent).mState & 7) == 1)) {
      local_72a = 1;
    }
    __gnu_cxx::
    __normal_iterator<ot::commissioner::persistent_storage::BorderRouter_*,_std::vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>_>
    ::operator++(&__end2);
  }
  peVar3 = std::
           __shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mInterpreter->mRegistry);
  local_72b = persistent_storage::Registry::GetNetworkByXpan(peVar3,aNid,(Network *)local_700);
  if (local_72b != kSuccess) {
    PrepareDtlsConfig::anon_class_1_0_00000001::operator()(&local_80a);
    local_430 = &local_808;
    local_438 = &local_809;
    bVar7 = ::fmt::v10::operator()(local_438);
    local_800 = (char *)bVar7.size_;
    local_808 = (v10 *)bVar7.data_;
    ::fmt::v10::detail::
    check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FMT_COMPILE_STRING,_0>
              ();
    utils::Hex<unsigned_long>(&local_830,aNid);
    local_440 = &local_7f8;
    local_450 = local_808;
    pcStack_448 = local_800;
    local_458 = &local_830;
    local_110 = &local_450;
    local_468 = local_808;
    local_460 = local_800;
    local_108 = local_468;
    pcStack_100 = local_460;
    local_488[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                             ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_458,(v10 *)aNid,local_440);
    local_218 = local_478;
    local_220 = local_488;
    local_208 = 0xd;
    fmt_00.size_ = 0xd;
    fmt_00.data_ = local_460;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)local_220;
    local_210 = local_220;
    local_200 = local_218;
    local_168 = local_220;
    ::fmt::v10::vformat_abi_cxx11_(&local_7f8,local_468,fmt_00,args_00);
    Error::Error(&local_7d8,kNotFound,&local_7f8);
    Error::operator=(__return_storage_ptr__,&local_7d8);
    Error::~Error(&local_7d8);
    std::__cxx11::string::~string((string *)&local_7f8);
    std::__cxx11::string::~string((string *)&local_830);
    goto LAB_003b633e;
  }
  dtlsConfig.mCommissionerToken.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0 < (int)nwk.mMlp.field_2._8_4_;
  peVar3 = std::
           __shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mInterpreter->mRegistry);
  local_72b = persistent_storage::Registry::GetDomainNameByXpan(peVar3,aNid,(string *)local_620);
  if (local_72b != kSuccess) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_850,"job-manager",&local_851);
    PrepareDtlsConfig::anon_class_1_0_00000001::operator()(&local_88a);
    local_3b0 = &local_888;
    local_3b8 = &local_889;
    bVar7 = ::fmt::v10::operator()(local_3b8);
    local_880 = (char *)bVar7.size_;
    local_888 = (v10 *)bVar7.data_;
    ::fmt::v10::detail::
    check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_FMT_COMPILE_STRING,_0>
              ();
    utils::Hex<unsigned_long>((string *)(local_8b4 + 4),aNid);
    local_8b4 = (undefined1  [4])(uint)local_72b;
    local_3c0 = &local_878;
    local_3d0 = local_888;
    pcStack_3c8 = local_880;
    local_3d8 = (v10 *)(local_8b4 + 4);
    local_3e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8b4;
    local_f0 = &local_3d0;
    local_3f0 = local_888;
    local_3e8 = local_880;
    local_e8 = local_3f0;
    pcStack_e0 = local_3e8;
    ::fmt::v10::
    make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,int>
              (&local_428,local_3d8,local_3e0,(int *)local_888);
    local_c8 = local_400;
    local_d0 = &local_428;
    local_b8 = 0x1d;
    fmt_01.size_ = 0x1d;
    fmt_01.data_ = local_3e8;
    args_01.field_1.values_ = in_R9.values_;
    args_01.desc_ = (unsigned_long_long)local_d0;
    local_c0 = local_d0;
    local_b0 = local_c8;
    local_a8 = local_d0;
    ::fmt::v10::vformat_abi_cxx11_(&local_878,local_3f0,fmt_01,args_01);
    Log(kDebug,&local_850,&local_878);
    std::__cxx11::string::~string((string *)&local_878);
    std::__cxx11::string::~string((string *)(local_8b4 + 4));
    std::__cxx11::string::~string((string *)&local_850);
    std::allocator<char>::~allocator((allocator<char> *)&local_851);
  }
  aConfig->mEnableCcm =
       (bool)(dtlsConfig.mCommissionerToken.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._7_1_ & 1);
  uVar4 = std::__cxx11::string::empty();
  if (((uVar4 & 1) == 0) && ((local_729 & 1) != 0)) {
    std::__cxx11::string::operator=((string *)&aConfig->mDomainName,(string *)local_620);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_620,"DefaultDomain");
    if (!bVar1) {
      Error::Error(&local_a58);
      Error::operator=(__return_storage_ptr__,&local_a58);
      Error::~Error(&local_a58);
      goto LAB_003b5527;
    }
    security_material::GetDomainSM(&local_8e0,(string *)local_620,(SecurityMaterials *)&nwk.mCcm);
    Error::operator=(__return_storage_ptr__,&local_8e0);
    Error::~Error(&local_8e0);
    Error::Error(&local_908);
    bVar1 = Error::operator!=(&local_908,__return_storage_ptr__);
    Error::~Error(&local_908);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_928,"job-manager",&local_929);
      PrepareDtlsConfig::anon_class_1_0_00000001::operator()(&local_962);
      local_3a0 = &local_960;
      local_3a8 = &local_961;
      bVar7 = ::fmt::v10::operator()(local_3a8);
      local_958 = (char *)bVar7.size_;
      local_960 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar7.data_;
      ::fmt::v10::detail::
      check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                ();
      local_508 = Error::GetMessage_abi_cxx11_(__return_storage_ptr__);
      local_4f0 = &local_950;
      local_500 = local_960;
      pcStack_4f8 = local_958;
      local_280 = &local_500;
      local_518 = local_960;
      local_510 = local_958;
      local_278 = local_518;
      pcStack_270 = local_510;
      local_538[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                               ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_508,(v10 *)local_4f0,local_960);
      local_1f0 = local_528;
      local_1f8 = local_538;
      local_1e0 = 0xd;
      fmt_02.size_ = 0xd;
      fmt_02.data_ = local_510;
      args_02.field_1.values_ = in_R9.values_;
      args_02.desc_ = (unsigned_long_long)local_1f8;
      local_1e8 = local_1f8;
      local_1d8 = local_1f0;
      local_170 = local_1f8;
      ::fmt::v10::vformat_abi_cxx11_(&local_950,(v10 *)local_518,fmt_02,args_02);
      Log(kDebug,&local_928,&local_950);
      std::__cxx11::string::~string((string *)&local_950);
      std::__cxx11::string::~string((string *)&local_928);
      std::allocator<char>::~allocator((allocator<char> *)&local_929);
      EVar2 = Error::GetCode(__return_storage_ptr__);
      if (EVar2 != kNotFound) {
        psVar5 = Error::GetMessage_abi_cxx11_(__return_storage_ptr__);
        std::__cxx11::string::string((string *)&local_988,(string *)psVar5);
        WarningMsg(this,aNid,&local_988);
        std::__cxx11::string::~string((string *)&local_988);
      }
      Error::Error(&local_9b0);
      Error::operator=(__return_storage_ptr__,&local_9b0);
      Error::~Error(&local_9b0);
    }
    bVar1 = security_material::SecurityMaterials::IsEmpty
                      ((SecurityMaterials *)&nwk.mCcm,
                       (bool)(dtlsConfig.mCommissionerToken.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
    if (bVar1) goto LAB_003b5527;
    if ((local_72a & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_9d0,"job-manager",&local_9d1);
      PrepareDtlsConfig::anon_class_1_0_00000001::operator()(&local_a0a);
      local_2b8 = &local_a08;
      local_2c0 = &local_a09;
      bVar7 = ::fmt::v10::operator()(local_2c0);
      local_a00 = (char *)bVar7.size_;
      local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar7.data_;
      ::fmt::v10::detail::
      check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                ();
      utils::Hex<unsigned_long>(&local_a30,aNid);
      local_2e8 = &nwk;
      local_2c8 = &local_9f8;
      local_2d8 = local_a08;
      pcStack_2d0 = local_a00;
      local_2e0 = &local_a30;
      local_a0 = &local_2d8;
      local_2f8 = local_a08;
      local_2f0 = local_a00;
      local_98 = local_2f8;
      pcStack_90 = local_2f0;
      ::fmt::v10::
      make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,std::__cxx11::string>
                (&local_328,(v10 *)local_2e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8,
                 local_a08);
      local_60 = local_308;
      local_68 = &local_328;
      local_50 = 0xdd;
      fmt_03.size_ = 0xdd;
      fmt_03.data_ = local_2f0;
      args_03.field_1.values_ = in_R9.values_;
      args_03.desc_ = (unsigned_long_long)local_68;
      local_58 = local_68;
      local_48 = local_60;
      local_40 = local_68;
      ::fmt::v10::vformat_abi_cxx11_(&local_9f8,(v10 *)local_2f8,fmt_03,args_03);
      Log(kDebug,&local_9d0,&local_9f8);
      std::__cxx11::string::~string((string *)&local_9f8);
      std::__cxx11::string::~string((string *)&local_a30);
      std::__cxx11::string::~string((string *)&local_9d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_9d1);
    }
  }
  else {
LAB_003b5527:
    utils::Hex<unsigned_long>(&local_aa0,nwk.mName.field_2._8_8_);
    security_material::GetNetworkSM
              (&local_a80,&local_aa0,(bool)(local_729 & 1),(bool)(local_72a & 1),
               (SecurityMaterials *)&nwk.mCcm);
    Error::operator=(__return_storage_ptr__,&local_a80);
    Error::~Error(&local_a80);
    std::__cxx11::string::~string((string *)&local_aa0);
    Error::Error(&local_ac8);
    bVar1 = Error::operator!=(&local_ac8,__return_storage_ptr__);
    Error::~Error(&local_ac8);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_ae8,"job-manager",&local_ae9);
      PrepareDtlsConfig::anon_class_1_0_00000001::operator()(&local_b22);
      local_2a8 = &local_b20;
      local_2b0 = &local_b21;
      bVar7 = ::fmt::v10::operator()(local_2b0);
      local_b18 = (char *)bVar7.size_;
      local_b20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar7.data_;
      ::fmt::v10::detail::
      check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                ();
      local_558 = Error::GetMessage_abi_cxx11_(__return_storage_ptr__);
      local_540 = &local_b10;
      local_550 = local_b20;
      pcStack_548 = local_b18;
      local_260 = &local_550;
      local_568 = local_b20;
      local_560 = local_b18;
      local_258 = local_568;
      pcStack_250 = local_560;
      local_588[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                               ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_558,(v10 *)local_540,local_b20);
      local_1c8 = local_578;
      local_1d0 = local_588;
      local_1b8 = 0xd;
      fmt_04.size_ = 0xd;
      fmt_04.data_ = local_560;
      args_04.field_1.values_ = in_R9.values_;
      args_04.desc_ = (unsigned_long_long)local_1d0;
      local_1c0 = local_1d0;
      local_1b0 = local_1c8;
      local_178 = local_1d0;
      ::fmt::v10::vformat_abi_cxx11_(&local_b10,(v10 *)local_568,fmt_04,args_04);
      Log(kDebug,&local_ae8,&local_b10);
      std::__cxx11::string::~string((string *)&local_b10);
      std::__cxx11::string::~string((string *)&local_ae8);
      std::allocator<char>::~allocator((allocator<char> *)&local_ae9);
      EVar2 = Error::GetCode(__return_storage_ptr__);
      if (EVar2 != kNotFound) {
        psVar5 = Error::GetMessage_abi_cxx11_(__return_storage_ptr__);
        std::__cxx11::string::string((string *)&local_b48,(string *)psVar5);
        WarningMsg(this,aNid,&local_b48);
        std::__cxx11::string::~string((string *)&local_b48);
      }
      Error::Error(&local_b70);
      Error::operator=(__return_storage_ptr__,&local_b70);
      Error::~Error(&local_b70);
    }
    bVar1 = security_material::SecurityMaterials::IsAnyFound
                      ((SecurityMaterials *)&nwk.mCcm,(bool)(local_729 & 1),(bool)(local_72a & 1),
                       false);
    if (!bVar1) {
      security_material::GetNetworkSM
                (&local_b98,(string *)&nwk,(bool)(local_729 & 1),(bool)(local_72a & 1),
                 (SecurityMaterials *)&nwk.mCcm);
      Error::operator=(__return_storage_ptr__,&local_b98);
      Error::~Error(&local_b98);
      Error::Error(&local_bc0);
      bVar1 = Error::operator!=(&local_bc0,__return_storage_ptr__);
      Error::~Error(&local_bc0);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_be0,"job-manager",&local_be1);
        PrepareDtlsConfig::anon_class_1_0_00000001::operator()(&local_c1a);
        local_298 = &local_c18;
        local_2a0 = &local_c19;
        bVar7 = ::fmt::v10::operator()(local_2a0);
        local_c10 = (char *)bVar7.size_;
        local_c18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar7.data_
        ;
        ::fmt::v10::detail::
        check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                  ();
        local_5a8 = Error::GetMessage_abi_cxx11_(__return_storage_ptr__);
        local_590 = &local_c08;
        local_5a0 = local_c18;
        pcStack_598 = local_c10;
        local_240 = &local_5a0;
        local_5b8 = local_c18;
        local_5b0 = local_c10;
        local_238 = local_5b8;
        pcStack_230 = local_5b0;
        error = (Error *)::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                                   ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)local_5a8,(v10 *)local_590,local_c18);
        local_1a0 = local_5c8;
        local_1a8 = &error;
        local_190 = 0xd;
        fmt_05.size_ = 0xd;
        fmt_05.data_ = local_5b0;
        args_05.field_1.values_ = in_R9.values_;
        args_05.desc_ = (unsigned_long_long)local_1a8;
        local_198 = local_1a8;
        local_188 = local_1a0;
        local_180 = local_1a8;
        ::fmt::v10::vformat_abi_cxx11_(&local_c08,(v10 *)local_5b8,fmt_05,args_05);
        Log(kDebug,&local_be0,&local_c08);
        std::__cxx11::string::~string((string *)&local_c08);
        std::__cxx11::string::~string((string *)&local_be0);
        std::allocator<char>::~allocator((allocator<char> *)&local_be1);
        EVar2 = Error::GetCode(__return_storage_ptr__);
        if (EVar2 != kNotFound) {
          psVar5 = Error::GetMessage_abi_cxx11_(__return_storage_ptr__);
          std::__cxx11::string::string((string *)&local_c40,(string *)psVar5);
          WarningMsg(this,aNid,&local_c40);
          std::__cxx11::string::~string((string *)&local_c40);
        }
        Error::Error(&local_c68);
        Error::operator=(__return_storage_ptr__,&local_c68);
        Error::~Error(&local_c68);
      }
    }
  }
  sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &dtlsConfig.mPrivateKey.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  if (sVar6 != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&aConfig->mCertificate,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &dtlsConfig.mPrivateKey.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &dtlsConfig.mPSKc.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  if (sVar6 != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&aConfig->mPrivateKey,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &dtlsConfig.mPSKc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &dtlsConfig.mCertificate.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  if (sVar6 != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&aConfig->mTrustAnchor,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &dtlsConfig.mCertificate.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &dtlsConfig.mTrustAnchor.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  if (sVar6 != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&aConfig->mCommissionerToken,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &dtlsConfig.mTrustAnchor.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&nwk.mCcm);
  if (sVar6 != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&aConfig->mPSKc,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&nwk.mCcm);
  }
  bVar1 = security_material::SecurityMaterials::IsEmpty
                    ((SecurityMaterials *)&nwk.mCcm,
                     (bool)(dtlsConfig.mCommissionerToken.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_c88,
               "no updates to DTLS configuration, default configuration will be used",&local_c89);
    InfoMsg(this,aNid,&local_c88);
    std::__cxx11::string::~string((string *)&local_c88);
    std::allocator<char>::~allocator((allocator<char> *)&local_c89);
  }
  sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&aConfig->mCertificate);
  if (sVar6 != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &dtlsConfig.mPrivateKey.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&aConfig->mCertificate);
  }
  sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&aConfig->mPrivateKey);
  if (sVar6 != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &dtlsConfig.mPSKc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&aConfig->mPrivateKey);
  }
  sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&aConfig->mTrustAnchor);
  if (sVar6 != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &dtlsConfig.mCertificate.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&aConfig->mTrustAnchor);
  }
  sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    (&aConfig->mCommissionerToken);
  if (sVar6 != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &dtlsConfig.mTrustAnchor.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&aConfig->mCommissionerToken);
  }
  sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&aConfig->mPSKc);
  if (sVar6 != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&nwk.mCcm,&aConfig->mPSKc);
  }
  bVar1 = security_material::SecurityMaterials::IsIncomplete
                    ((SecurityMaterials *)&nwk.mCcm,(bool)(local_729 & 1),(bool)(local_72a & 1),
                     (bool)(dtlsConfig.mCommissionerToken.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
  if (bVar1) {
    PrepareDtlsConfig::anon_class_1_0_00000001::operator()(&local_cea);
    local_288 = &local_ce8;
    local_290 = &local_ce9;
    bVar7 = ::fmt::v10::operator()(local_290);
    local_ce0 = (char *)bVar7.size_;
    local_ce8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar7.data_;
    ::fmt::v10::detail::
    check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
              ();
    utils::Hex<unsigned_long>(&local_d10,aNid);
    local_350 = &nwk;
    local_330 = &local_cd8;
    local_340 = local_ce8;
    pcStack_338 = local_ce0;
    local_348 = &local_d10;
    local_80 = &local_340;
    local_360 = local_ce8;
    local_358 = local_ce0;
    local_78 = local_360;
    pcStack_70 = local_358;
    ::fmt::v10::
    make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,std::__cxx11::string>
              (&local_398,(v10 *)local_348,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350,
               local_ce8);
    local_30 = local_370;
    local_38 = &local_398;
    local_20 = 0xdd;
    fmt_06.size_ = 0xdd;
    fmt_06.data_ = local_358;
    args_06.field_1.values_ = in_R9.values_;
    args_06.desc_ = (unsigned_long_long)local_38;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v10::vformat_abi_cxx11_(&local_cd8,(v10 *)local_360,fmt_06,args_06);
    Error::Error(&local_cb8,kSecurity,&local_cd8);
    Error::operator=(__return_storage_ptr__,&local_cb8);
    Error::~Error(&local_cb8);
    std::__cxx11::string::~string((string *)&local_cd8);
    std::__cxx11::string::~string((string *)&local_d10);
  }
LAB_003b633e:
  domainName.field_2._M_local_buf[0xf] = '\x01';
  std::
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ::~vector((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
             *)local_728);
  persistent_storage::Network::~Network((Network *)local_700);
  security_material::SecurityMaterials::~SecurityMaterials((SecurityMaterials *)&nwk.mCcm);
  std::__cxx11::string::~string((string *)local_620);
  if ((domainName.field_2._M_local_buf[0xf] & 1U) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error JobManager::PrepareDtlsConfig(uint64_t aNid, Config &aConfig)
{
    Error             error;
    std::string       domainName;
    bool              isCCM = false;
    SecurityMaterials dtlsConfig;
    Network           nwk;
    BRArray           brs;
    bool              needCert = false;
    bool              needPSKc = false;
    RegistryStatus    status   = mInterpreter.mRegistry->GetBorderRoutersInNetwork(aNid, brs);

    VerifyOrExit(status == RegistryStatus::kSuccess,
                 error = ERROR_REGISTRY_ERROR("br lookup failed with status={}", static_cast<int>(status)));

    // review the network BRs connection modes that may require
    // certain supported type of credentials
    for (const auto &br : brs)
    {
        if (br.mAgent.mState.mConnectionMode == BorderAgent::State::ConnectionMode::kVendorSpecific ||
            br.mAgent.mState.mConnectionMode == BorderAgent::State::ConnectionMode::kX509Connection)
        {
            needCert = true;
        }
        if (br.mAgent.mState.mConnectionMode == BorderAgent::State::ConnectionMode::kVendorSpecific ||
            br.mAgent.mState.mConnectionMode == BorderAgent::State::ConnectionMode::kPSKcConnection)
        {
            needPSKc = true;
        }
    }

    /// @note: If vendor specific connection mode encountered, PSKc as
    ///        well as X.509 cert will be prepared to be available to
    ///        choose from; in case of another security material
    ///        type(s) required by BR vendor, please update
    ///        JobManager::PrepareDtlsConfig() method appropriately.

    status = mInterpreter.mRegistry->GetNetworkByXpan(aNid, nwk);
    VerifyOrExit(status == RegistryStatus::kSuccess,
                 error = ERROR_NOT_FOUND("network not found by XPAN '{}'", utils::Hex(aNid)));
    isCCM  = nwk.mCcm > 0;
    status = mInterpreter.mRegistry->GetDomainNameByXpan(aNid, domainName);
    if (status != RegistryStatus::kSuccess)
    {
        LOG_DEBUG(LOG_REGION_JOB_MANAGER, "{}: domain resolution failed with status={}", utils::Hex(aNid),
                  static_cast<int>(status));
    }

    aConfig.mEnableCcm = isCCM;
    if (!domainName.empty() && needCert)
    {
        aConfig.mDomainName = domainName;
        if (domainName != "DefaultDomain")
        {
            error = security_material::GetDomainSM(domainName, dtlsConfig);
            if (ERROR_NONE != error)
            {
                LOG_STR(DEBUG, LOG_REGION_JOB_MANAGER, error.GetMessage());
                if (ErrorCode::kNotFound != error.GetCode())
                {
                    WarningMsg(aNid, error.GetMessage());
                }
                error = ERROR_NONE;
            }
            if (!dtlsConfig.IsEmpty(isCCM))
            {
                if (needPSKc)
                {
                    /// @note: Please also note for CCM networks that only
                    ///        X.509 based credentials are valid for
                    ///        loading. Therefore, any other connection
                    ///        mode is considered a wrong configuration of
                    ///        border router, and respectively ignored.
                    LOG_DEBUG(LOG_REGION_JOB_MANAGER, "loading PSKc ignored for CCM network [{}:'{}']",
                              utils::Hex(aNid), nwk.mName);
                }
                goto update;
            }
        }
        else
        {
            // a network of DefaultDomain is a non-CCM one; we will
            // look up in a folder under nwk later
            error = ERROR_NONE;
        }
    }

    error = security_material::GetNetworkSM(utils::Hex(nwk.mXpan), needCert, needPSKc, dtlsConfig);
    if (ERROR_NONE != error)
    {
        LOG_STR(DEBUG, LOG_REGION_JOB_MANAGER, error.GetMessage());
        if (ErrorCode::kNotFound != error.GetCode())
        {
            WarningMsg(aNid, error.GetMessage());
        }
        // else we try a chance with nwk.mName later
        error = ERROR_NONE;
    }
    if (dtlsConfig.IsAnyFound(needCert, needPSKc))
    {
        goto update;
    }
    error = security_material::GetNetworkSM(nwk.mName, needCert, needPSKc, dtlsConfig);
    if (ERROR_NONE != error)
    {
        LOG_STR(DEBUG, LOG_REGION_JOB_MANAGER, error.GetMessage());
        if (ErrorCode::kNotFound != error.GetCode())
        {
            WarningMsg(aNid, error.GetMessage());
        }
        // nothing found, so continue with default values
        error = ERROR_NONE;
    }
update:

#define UPDATE_IF_SET(name)            \
    if (dtlsConfig.m##name.size() > 0) \
    aConfig.m##name = dtlsConfig.m##name

    UPDATE_IF_SET(Certificate);
    UPDATE_IF_SET(PrivateKey);
    UPDATE_IF_SET(TrustAnchor);
    UPDATE_IF_SET(CommissionerToken);
    UPDATE_IF_SET(PSKc);

#undef UPDATE_IF_SET

    if (dtlsConfig.IsEmpty(isCCM))
    {
        InfoMsg(aNid, "no updates to DTLS configuration, default configuration will be used");
    }

#define UPDATE_IF_SET(name)         \
    if (aConfig.m##name.size() > 0) \
    dtlsConfig.m##name = aConfig.m##name

    UPDATE_IF_SET(Certificate);
    UPDATE_IF_SET(PrivateKey);
    UPDATE_IF_SET(TrustAnchor);
    UPDATE_IF_SET(CommissionerToken);
    UPDATE_IF_SET(PSKc);

#undef UPDATE_IF_SET
    if (dtlsConfig.IsIncomplete(needCert, needPSKc, isCCM))
    {
        error = ERROR_SECURITY("incomplete DTLS configuration for the network [{}:'{}']", utils::Hex(aNid), nwk.mName);
    }
exit:
    return error;
}